

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O2

int Abc_TgCannonVerify(Abc_TgMan_t *pMan)

{
  uint uCanonPhase;
  word *pTruth;
  int iVar1;
  int nWords;
  char acStack_48 [24];
  
  pTruth = pMan->pTruth;
  iVar1 = pMan->nVars;
  uCanonPhase = pMan->uPhase;
  nWords = 1 << ((char)iVar1 - 6U & 0x1f);
  if ((long)iVar1 < 7) {
    nWords = 1;
  }
  Abc_TtVerifySmallTruth(pTruth,iVar1);
  Abc_TtCopy((word *)Abc_TtCannonVerify_pCopy2,pTruth,nWords,0);
  memcpy(acStack_48,pMan->pPermT,(long)iVar1);
  Abc_TtImplementNpnConfig((word *)Abc_TtCannonVerify_pCopy2,iVar1,acStack_48,uCanonPhase);
  iVar1 = Abc_TtEqual(gpVerCopy,(word *)Abc_TtCannonVerify_pCopy2,nWords);
  return iVar1;
}

Assistant:

static inline int Abc_TgCannonVerify(Abc_TgMan_t* pMan)
{
    return Abc_TtCannonVerify(pMan->pTruth, pMan->nVars, pMan->pPermT, pMan->uPhase);
}